

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLowering.cpp
# Opt level: O1

void __thiscall wasm::StringLowering::makeImports(StringLowering *this,Module *module)

{
  pointer puVar1;
  Expression *pEVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  long *plVar7;
  undefined1 reuse;
  uint uVar8;
  size_type *psVar9;
  Global *pGVar10;
  pointer puVar11;
  uint __val;
  string_view sVar12;
  string_view sVar13;
  string_view s;
  string_view s_00;
  string_view str_00;
  undefined1 local_690 [8];
  stringstream json;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_680 [7];
  ios_base local_610 [264];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  undefined1 local_380 [8];
  stringstream utf8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  char *local_360;
  pointer pcStack_358;
  pointer local_350;
  ios_base local_300 [264];
  undefined1 local_1f8 [8];
  __string_type jsonString;
  size_t local_70;
  char *local_68;
  char *pcStack_58;
  vector<char,_std::allocator<char>_> vec;
  char local_31;
  
  local_380 = (undefined1  [8])&local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"string-constants-module","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1f8,WasmStringConstsModule,(allocator<char> *)&local_508);
  pGVar10 = (Global *)local_1f8;
  Pass::getArgumentOrDefault((string *)local_690,(Pass *)this,(string *)local_380,(string *)pGVar10)
  ;
  sVar12._M_str = (char *)0x0;
  sVar12._M_len = (size_t)local_690;
  sVar12 = IString::interned(_json,sVar12,SUB81(pGVar10,0));
  if (local_690 != (undefined1  [8])local_680) {
    operator_delete((void *)local_690,local_680[0]._M_allocated_capacity + 1);
  }
  if (local_1f8 != (undefined1  [8])&jsonString._M_string_length) {
    operator_delete((void *)local_1f8,jsonString._M_string_length + 1);
  }
  if (local_380 != (undefined1  [8])&local_370) {
    operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_690);
  puVar11 = (module->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar11 != puVar1) {
    bVar4 = true;
    __val = 0;
    do {
      pEVar2 = ((puVar11->_M_t).
                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init;
      if ((pEVar2 != (Expression *)0x0) && (pEVar2->_id == StringConstId)) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_380);
        if (this->useMagicImports == true) {
          bVar5 = String::convertUTF16ToUTF8
                            ((ostream *)local_370._M_local_buf,*(string_view *)(pEVar2 + 1));
          if (!bVar5) goto LAB_00a6c90b;
          pGVar10 = (puVar11->_M_t).
                    super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                    super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
          local_70 = sVar12._M_len;
          (pGVar10->super_Importable).module.super_IString.str._M_len = local_70;
          local_68 = sVar12._M_str;
          *(char **)((long)&(pGVar10->super_Importable).module + 8) = local_68;
          std::__cxx11::stringbuf::str();
          s._M_str = (char *)0x0;
          s._M_len = (size_t)local_1f8;
          sVar13 = IString::interned((IString *)
                                     CONCAT44(jsonString._M_dataplus._M_p._4_4_,
                                              (uint)jsonString._M_dataplus._M_p),s,SUB81(local_68,0)
                                    );
          pGVar10 = (puVar11->_M_t).
                    super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                    super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
          (pGVar10->super_Importable).base.super_IString.str = sVar13;
          if (local_1f8 != (undefined1  [8])&jsonString._M_string_length) {
            operator_delete((void *)local_1f8,jsonString._M_string_length + 1);
          }
        }
        else {
LAB_00a6c90b:
          if (this->assertUTF8 == true) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1f8);
            std::__cxx11::stringbuf::str();
            sVar13._M_str = (char *)pGVar10;
            sVar13._M_len = (size_t)local_508._M_current;
            String::printEscaped
                      ((String *)&jsonString._M_string_length,(ostream *)str._M_dataplus._M_p,sVar13
                      );
            if ((size_type *)local_508._M_current != &str._M_string_length) {
              operator_delete(local_508._M_current,str._M_string_length + 1);
            }
            Fatal::Fatal((Fatal *)&local_508);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&str._M_string_length,"Cannot lower non-UTF-16 string ",0x1f);
            std::__cxx11::stringbuf::str();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&str._M_string_length,pcStack_58,
                       (long)vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
            local_31 = '\n';
            Fatal::operator<<((Fatal *)&local_508,&local_31);
            std::__cxx11::string::~string((string *)&pcStack_58);
            Fatal::~Fatal((Fatal *)&local_508);
          }
          sVar13 = IString::interned((IString *)0xc,(string_view)ZEXT816(0xe21f9c),SUB81(pGVar10,0))
          ;
          pGVar10 = (puVar11->_M_t).
                    super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                    super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
          (pGVar10->super_Importable).module.super_IString.str = sVar13;
          cVar6 = '\x01';
          if (9 < __val) {
            pGVar10 = (Global *)(ulong)__val;
            cVar3 = '\x04';
            do {
              cVar6 = cVar3;
              uVar8 = (uint)pGVar10;
              if (uVar8 < 100) {
                cVar6 = cVar6 + -2;
                goto LAB_00a6c988;
              }
              if (uVar8 < 1000) {
                cVar6 = cVar6 + -1;
                goto LAB_00a6c988;
              }
              if (uVar8 < 10000) goto LAB_00a6c988;
              pGVar10 = (Global *)((ulong)pGVar10 / 10000);
              cVar3 = cVar6 + '\x04';
            } while (99999 < uVar8);
            cVar6 = cVar6 + '\x01';
          }
LAB_00a6c988:
          reuse = SUB81(pGVar10,0);
          local_1f8 = (undefined1  [8])&jsonString._M_string_length;
          std::__cxx11::string::_M_construct((ulong)local_1f8,cVar6);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)local_1f8,(uint)jsonString._M_dataplus._M_p,__val);
          s_00._M_str = (char *)0x0;
          s_00._M_len = (size_t)local_1f8;
          sVar13 = IString::interned((IString *)
                                     CONCAT44(jsonString._M_dataplus._M_p._4_4_,
                                              (uint)jsonString._M_dataplus._M_p),s_00,(bool)reuse);
          pGVar10 = (puVar11->_M_t).
                    super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                    super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
          (pGVar10->super_Importable).base.super_IString.str = sVar13;
          if (local_1f8 != (undefined1  [8])&jsonString._M_string_length) {
            operator_delete((void *)local_1f8,jsonString._M_string_length + 1);
          }
          if (bVar4) {
            bVar4 = false;
          }
          else {
            local_1f8[0] = 0x2c;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_680[0]._M_local_buf,local_1f8,1);
          }
          str_00._M_str = (char *)pGVar10;
          str_00._M_len = pEVar2[1].type.id;
          String::printEscapedJSON
                    ((String *)local_680[0]._M_local_buf,*(ostream **)(pEVar2 + 1),str_00);
          __val = __val + 1;
        }
        ((puVar11->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init = (Expression *)0x0;
        std::__cxx11::stringstream::~stringstream((stringstream *)local_380);
        std::ios_base::~ios_base(local_300);
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar1);
  }
  std::__cxx11::stringbuf::str();
  if (CONCAT44(jsonString._M_dataplus._M_p._4_4_,(uint)jsonString._M_dataplus._M_p) != 0) {
    if (this->assertUTF8 == true) {
      __assert_fail("!assertUTF8",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/StringLowering.cpp"
                    ,0x117,"void wasm::StringLowering::makeImports(Module *)");
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380,
                   '[',(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8);
    plVar7 = (long *)std::__cxx11::string::_M_replace_aux((ulong)local_380,_utf8,0,'\x01');
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar9) {
      str._M_string_length = *psVar9;
      str.field_2._M_allocated_capacity = plVar7[3];
      local_508._M_current = (char *)&str._M_string_length;
    }
    else {
      str._M_string_length = *psVar9;
      local_508._M_current = (char *)*plVar7;
    }
    str._M_dataplus._M_p = (pointer)plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (local_380 != (undefined1  [8])&local_370) {
      operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
    }
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((vector<char,std::allocator<char>> *)&pcStack_58,local_508,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(str._M_dataplus._M_p + local_508._M_current),(allocator_type *)local_380);
    local_380 = (undefined1  [8])&local_370;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"string.consts","");
    local_360 = pcStack_58;
    pcStack_358 = vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_350 = vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_finish;
    pcStack_58 = (char *)0x0;
    vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::
    emplace_back<wasm::CustomSection>(&module->customSections,(CustomSection *)local_380);
    if (local_360 != (char *)0x0) {
      operator_delete(local_360,(long)local_350 - (long)local_360);
    }
    if (local_380 != (undefined1  [8])&local_370) {
      operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
    }
    if (pcStack_58 != (char *)0x0) {
      operator_delete(pcStack_58,
                      (long)vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pcStack_58);
    }
    if ((size_type *)local_508._M_current != &str._M_string_length) {
      operator_delete(local_508._M_current,str._M_string_length + 1);
    }
  }
  if (local_1f8 != (undefined1  [8])&jsonString._M_string_length) {
    operator_delete((void *)local_1f8,jsonString._M_string_length + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_690);
  std::ios_base::~ios_base(local_610);
  return;
}

Assistant:

void makeImports(Module* module) {
    Name stringConstsModule =
      getArgumentOrDefault("string-constants-module", WasmStringConstsModule);
    Index jsonImportIndex = 0;
    std::stringstream json;
    bool first = true;
    for (auto& global : module->globals) {
      if (global->init) {
        if (auto* c = global->init->dynCast<StringConst>()) {
          std::stringstream utf8;
          if (useMagicImports &&
              String::convertUTF16ToUTF8(utf8, c->string.str)) {
            global->module = stringConstsModule;
            global->base = Name(utf8.str());
          } else {
            if (assertUTF8) {
              std::stringstream escaped;
              String::printEscaped(escaped, utf8.str());
              Fatal() << "Cannot lower non-UTF-16 string " << escaped.str()
                      << '\n';
            }
            global->module = "string.const";
            global->base = std::to_string(jsonImportIndex);
            if (first) {
              first = false;
            } else {
              json << ',';
            }
            String::printEscapedJSON(json, c->string.str);
            jsonImportIndex++;
          }
          global->init = nullptr;
        }
      }
    }

    auto jsonString = json.str();
    if (!jsonString.empty()) {
      // If we are asserting UTF8, then we shouldn't be generating any JSON.
      assert(!assertUTF8);
      // Add a custom section with the JSON.
      auto str = '[' + jsonString + ']';
      auto vec = std::vector<char>(str.begin(), str.end());
      module->customSections.emplace_back(
        CustomSection{"string.consts", std::move(vec)});
    }
  }